

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::KeyValue::~KeyValue(KeyValue *this)

{
  ~KeyValue(this);
  operator_delete(this);
  return;
}

Assistant:

KeyValue::~KeyValue() noexcept {
}